

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,size_t nbSeq,uint maxCode,
                 FSE_CTable *fseCTable,U32 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  uint uVar1;
  ulong uVar2;
  uint local_6c;
  size_t sStack_68;
  uint max;
  size_t cSymbolTypeSizeEstimateInBits;
  BYTE *ctEnd;
  BYTE *ctStart;
  BYTE *ctp;
  uint *countWksp;
  U32 *additionalBits_local;
  FSE_CTable *fseCTable_local;
  size_t sStack_28;
  uint maxCode_local;
  size_t nbSeq_local;
  BYTE *codeTable_local;
  ulong uStack_10;
  symbolEncodingType_e type_local;
  
  ctp = (BYTE *)workspace;
  cSymbolTypeSizeEstimateInBits = (size_t)(codeTable + nbSeq);
  sStack_68 = 0;
  local_6c = maxCode;
  ctEnd = codeTable;
  ctStart = codeTable;
  countWksp = additionalBits;
  additionalBits_local = fseCTable;
  fseCTable_local._4_4_ = maxCode;
  sStack_28 = nbSeq;
  nbSeq_local = (size_t)codeTable;
  codeTable_local._4_4_ = type;
  HIST_countFast_wksp((uint *)workspace,&local_6c,codeTable,nbSeq,workspace,wkspSize);
  if (codeTable_local._4_4_ == set_basic) {
    sStack_68 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)ctp,local_6c);
  }
  else if (codeTable_local._4_4_ == set_rle) {
    sStack_68 = 0;
  }
  else if ((codeTable_local._4_4_ == set_compressed) || (codeTable_local._4_4_ == set_repeat)) {
    sStack_68 = ZSTD_fseBitCost(additionalBits_local,(uint *)ctp,local_6c);
  }
  uVar1 = ERR_isError(sStack_68);
  if (uVar1 == 0) {
    for (; ctStart < cSymbolTypeSizeEstimateInBits; ctStart = ctStart + 1) {
      if (countWksp == (uint *)0x0) {
        uVar2 = (ulong)*ctStart;
      }
      else {
        uVar2 = (ulong)countWksp[*ctStart];
      }
      sStack_68 = uVar2 + sStack_68;
    }
    uStack_10 = sStack_68 >> 3;
  }
  else {
    uStack_10 = sStack_28 * 10;
  }
  return uStack_10;
}

Assistant:

static size_t ZSTD_estimateBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, size_t nbSeq, unsigned maxCode,
                        const FSE_CTable* fseCTable,
                        const U32* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        (void)defaultMax;
        cSymbolTypeSizeEstimateInBits = ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) {
        return nbSeq * 10;
    }
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits >> 3;
}